

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::FsNode::Metadata> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryLstat
          (Maybe<kj::FsNode::Metadata> *__return_storage_ptr__,InMemoryDirectory *this,PathPtr path)

{
  bool bVar1;
  size_t sVar2;
  Impl *pIVar3;
  String *pSVar4;
  Own<const_kj::File,_std::nullptr_t> *this_00;
  File *pFVar5;
  Own<const_kj::Directory,_std::nullptr_t> *this_01;
  Directory *pDVar6;
  SymlinkNode *pSVar7;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *pOVar8;
  ReadableDirectory *pRVar9;
  stat *__buf;
  StringPtr name;
  StringPtr name_00;
  PathPtr PVar10;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *subdir;
  undefined1 local_180 [16];
  undefined1 local_170 [8];
  OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> _subdir1071;
  Fault local_158;
  Fault f;
  uint64_t hash;
  SymlinkNode *link;
  undefined4 local_dc;
  Metadata local_d8;
  EntryImpl *local_a8;
  EntryImpl *entry;
  StringPtr local_90;
  undefined1 local_80 [16];
  EntryImpl *_entry1055;
  undefined1 local_68 [8];
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (InMemoryDirectory *)path.parts.ptr;
  path_local.parts.size_ = (size_t)__return_storage_ptr__;
  sVar2 = PathPtr::size((PathPtr *)&this_local);
  if (sVar2 == 0) {
    stat((InMemoryDirectory *)&lock.ptr,(char *)this,__buf);
    Maybe<kj::FsNode::Metadata>::Maybe(__return_storage_ptr__,(Metadata *)&lock.ptr);
  }
  else {
    sVar2 = PathPtr::size((PathPtr *)&this_local);
    if (sVar2 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_68,
                 &this->impl);
      pIVar3 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                          local_68);
      pSVar4 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr(&local_90,pSVar4);
      name.content.size_ = (size_t)local_90.content.ptr;
      name.content.ptr = (char *)pIVar3;
      Impl::tryGetEntry((Impl *)local_80,name);
      local_80._8_8_ =
           kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_const>
                     ((Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
                      local_80);
      if ((EntryImpl *)local_80._8_8_ == (EntryImpl *)0x0) {
        Maybe<kj::FsNode::Metadata>::Maybe(__return_storage_ptr__);
        local_dc = 1;
      }
      else {
        local_a8 = (EntryImpl *)local_80._8_8_;
        bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                ::is<kj::(anonymous_namespace)::InMemoryDirectory::FileNode>
                          (&((EntryImpl *)local_80._8_8_)->node);
        if (bVar1) {
          this_00 = &OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                     ::get<kj::(anonymous_namespace)::InMemoryDirectory::FileNode>(&local_a8->node)
                     ->file;
          pFVar5 = Own<const_kj::File,_std::nullptr_t>::operator->(this_00);
          (*(pFVar5->super_ReadableFile).super_FsNode._vptr_FsNode[2])(&local_d8);
          Maybe<kj::FsNode::Metadata>::Maybe(__return_storage_ptr__,&local_d8);
          local_dc = 1;
        }
        else {
          bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                  ::is<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>(&local_a8->node)
          ;
          if (bVar1) {
            this_01 = &OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       ::get<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
                                 (&local_a8->node)->directory;
            pDVar6 = Own<const_kj::Directory,_std::nullptr_t>::operator->(this_01);
            (*(pDVar6->super_ReadableDirectory).super_FsNode._vptr_FsNode[2])(&link);
            Maybe<kj::FsNode::Metadata>::Maybe(__return_storage_ptr__,(Metadata *)&link);
            local_dc = 1;
          }
          else {
            bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                    ::is<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>(&local_a8->node)
            ;
            if (bVar1) {
              pSVar7 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       ::get<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                                 (&local_a8->node);
              String::begin(&pSVar7->content);
              f.exception._0_4_ = 2;
              Maybe<kj::FsNode::Metadata>::Maybe(__return_storage_ptr__,(Metadata *)&f);
              local_dc = 1;
            }
            else {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                        (&local_158,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                         ,0x429,FAILED,(char *)0x0,"\"unknown node type\"",
                         (char (*) [18])"unknown node type");
              Maybe<kj::FsNode::Metadata>::Maybe(__return_storage_ptr__);
              local_dc = 1;
              kj::_::Debug::Fault::~Fault(&local_158);
            }
          }
        }
      }
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_68);
    }
    else {
      pSVar4 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&subdir,pSVar4);
      name_00.content.size_ = (size_t)subdir;
      name_00.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_180,name_00);
      kj::_::readMaybe<kj::ReadableDirectory_const,decltype(nullptr)>
                ((_ *)local_170,
                 (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)local_180);
      Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)local_180);
      pOVar8 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_170);
      if (pOVar8 == (Own<const_kj::ReadableDirectory,_std::nullptr_t> *)0x0) {
        Maybe<kj::FsNode::Metadata>::Maybe(__return_storage_ptr__);
      }
      else {
        pOVar8 = kj::_::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::operator*
                           ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_170);
        pRVar9 = Own<const_kj::ReadableDirectory,_std::nullptr_t>::operator->(pOVar8);
        sVar2 = PathPtr::size((PathPtr *)&this_local);
        PVar10 = PathPtr::slice((PathPtr *)&this_local,1,sVar2);
        (*(pRVar9->super_FsNode)._vptr_FsNode[9])
                  (__return_storage_ptr__,pRVar9,PVar10.parts.ptr,PVar10.parts.size_);
      }
      local_dc = 1;
      kj::_::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::~OwnOwn
                ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_170);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<FsNode::Metadata> tryLstat(PathPtr path) const override {
    if (path.size() == 0) {
      return stat();
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        if (entry.node.is<FileNode>()) {
          return entry.node.get<FileNode>().file->stat();
        } else if (entry.node.is<DirectoryNode>()) {
          return entry.node.get<DirectoryNode>().directory->stat();
        } else if (entry.node.is<SymlinkNode>()) {
          auto& link = entry.node.get<SymlinkNode>();
          uint64_t hash = reinterpret_cast<uintptr_t>(link.content.begin());
          return FsNode::Metadata { FsNode::Type::SYMLINK, 0, 0, link.lastModified, 1, hash };
        } else {
          KJ_FAIL_ASSERT("unknown node type") { return kj::none; }
        }
      } else {
        return kj::none;
      }
    }